

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoderValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)600>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  undefined1 *puVar2;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  undefined1 *puVar3;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  allocator_type local_91;
  _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_90;
  undefined1 local_78 [40];
  Result result;
  TypeCase local_28 [2];
  
  puVar3 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar3 == (ModelDescription *)0x0) {
    puVar3 = Specification::_ModelDescription_default_instance_;
  }
  Result::Result(&result);
  local_90._M_impl.super__Vector_impl_data._M_start._0_1_ = false;
  local_90._M_impl.super__Vector_impl_data._M_start._1_1_ = false;
  local_90._M_impl.super__Vector_impl_data._M_start._2_1_ = false;
  local_90._M_impl.super__Vector_impl_data._M_start._3_1_ = false;
  validateModelDescription
            ((Result *)local_78,(ModelDescription *)puVar3,format->specificationversion_,
             (ValidationPolicy *)&local_90);
  Result::operator=(&result,(Result *)local_78);
  std::__cxx11::string::~string((string *)(local_78 + 8));
  bVar1 = Result::good(&result);
  if (bVar1) {
    local_28[0] = kInt64Type;
    local_28[1] = kStringType;
    __l._M_len = 2;
    __l._M_array = local_28;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_90,__l,&local_91);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_78,(CoreML *)&((ModelDescription *)puVar3)->input_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_90,
               in_R8);
    Result::operator=(&result,(Result *)local_78);
    std::__cxx11::string::~string((string *)(local_78 + 8));
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base(&local_90);
    bVar1 = Result::good(&result);
    if (bVar1) {
      if (format->_oneof_case_[0] == 600) {
        puVar2 = (undefined1 *)(format->Type_).onehotencoder_;
      }
      else {
        puVar2 = Specification::_OneHotEncoder_default_instance_;
      }
      local_28[0] = ((OneHotEncoder *)puVar2)->outputsparse_ + 5;
      __l_00._M_len = 1;
      __l_00._M_array = local_28;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)&local_90,__l_00,&local_91);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_78,(CoreML *)&((ModelDescription *)puVar3)->output_,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_90,
                 in_R8);
      Result::operator=(&result,(Result *)local_78);
      std::__cxx11::string::~string((string *)(local_78 + 8));
      std::
      _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~_Vector_base(&local_90);
      bVar1 = Result::good(&result);
      if (bVar1) {
        if (format->_oneof_case_[0] == 600) {
          puVar3 = (undefined1 *)(format->Type_).onehotencoder_;
        }
        else {
          puVar3 = Specification::_OneHotEncoder_default_instance_;
        }
        if (((OneHotEncoder *)puVar3)->_oneof_case_[0] == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_78,"OneHotEncoder parameter incorrect type",
                     (allocator<char> *)&local_90);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_78);
          std::__cxx11::string::~string((string *)local_78);
          goto LAB_002842e0;
        }
      }
    }
  }
  Result::Result(__return_storage_ptr__,&result);
LAB_002842e0:
  std::__cxx11::string::~string((string *)&result.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_oneHotEncoder>(const Specification::Model& format) {
        const auto& interface = format.description();

        Result result;

        // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1,
                                                             { Specification::FeatureType::kInt64Type,
                                                                 Specification::FeatureType::kStringType });
        if (!result.good()) {
            return result;
        }
        
        // If sparse then the input must be dictionary
        bool sparse = format.onehotencoder().outputsparse();

        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1,
                                                             {(sparse ? Specification::FeatureType::kDictionaryType : Specification::FeatureType::kMultiArrayType)});
        // Validate the outputs
        if (!result.good()) {
            return result;
        }
        
        // Validate the parameters
        switch (format.onehotencoder().CategoryType_case()) {
            case Specification::OneHotEncoder::kInt64Categories:
                break;
            case Specification::OneHotEncoder::kStringCategories:
                break;
            case Specification::OneHotEncoder::CATEGORYTYPE_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "OneHotEncoder parameter incorrect type");
        }

        return result;
    }